

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

void __thiscall
iutest::AssertionHelper::ScopedMessage::ScopedMessage(ScopedMessage *this,iuCodeMessage *msg)

{
  ScopedTrace *this_00;
  ScopedMessage *local_20;
  iuCodeMessage *local_18;
  iuCodeMessage *msg_local;
  ScopedMessage *this_local;
  
  local_18 = msg;
  msg_local = &this->super_iuCodeMessage;
  detail::iuCodeMessage::iuCodeMessage(&this->super_iuCodeMessage,msg);
  this_00 = ScopedTrace::GetInstance();
  local_20 = this;
  std::__cxx11::
  list<iutest::AssertionHelper::ScopedMessage_*,_std::allocator<iutest::AssertionHelper::ScopedMessage_*>_>
  ::push_back(&this_00->list,&local_20);
  return;
}

Assistant:

ScopedMessage(const detail::iuCodeMessage& msg) // NOLINT
            : detail::iuCodeMessage(msg)
        {
            ScopedTrace::GetInstance().list.push_back(this);
        }